

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsPixmapItemPrivate::updateShape(QGraphicsPixmapItemPrivate *this)

{
  ShapeMode SVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  undefined1 *puVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  double local_50;
  QRegion local_48;
  QRegion local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QPainterPath::QPainterPath((QPainterPath *)&local_68);
  puVar2 = *(undefined1 **)&this->shape;
  *(undefined1 **)&this->shape = local_68;
  local_68 = puVar2;
  QPainterPath::~QPainterPath((QPainterPath *)&local_68);
  SVar1 = this->shapeMode;
  if (SVar1 == HeuristicMaskShape) {
    QPixmap::createHeuristicMask(SUB81(&local_68,0));
LAB_005facc6:
    uVar10 = QRegion::QRegion(&local_48,(QBitmap *)&local_68);
    dVar4 = (this->offset).xp;
    dVar5 = (this->offset).yp;
    auVar11._0_8_ = (double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4;
    auVar11._8_8_ = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
    auVar11 = minpd(_DAT_0066f5d0,auVar11);
    auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
    auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
    movmskpd(uVar10,auVar12);
    QRegion::translated((int)&local_40,(int)&local_48);
    qt_regionToPath((QRegion *)&local_38);
    uVar3 = *(undefined8 *)&this->shape;
    *(undefined8 *)&this->shape = local_38;
    local_38 = uVar3;
    QPainterPath::~QPainterPath((QPainterPath *)&local_38);
    QRegion::~QRegion(&local_40);
    QRegion::~QRegion(&local_48);
    QBitmap::~QBitmap((QBitmap *)&local_68);
  }
  else {
    if (SVar1 != BoundingRectShape) {
      if (SVar1 != MaskShape) goto LAB_005fad7f;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::mask();
      cVar7 = QPixmap::isNull();
      if (cVar7 == '\0') goto LAB_005facc6;
      QBitmap::~QBitmap((QBitmap *)&local_68);
    }
    puVar2 = (undefined1 *)(this->offset).xp;
    puVar6 = (undefined1 *)(this->offset).yp;
    iVar8 = QPixmap::width();
    iVar9 = QPixmap::height();
    local_50 = (double)iVar9;
    local_68 = puVar2;
    puStack_60 = puVar6;
    local_58 = (undefined1 *)(double)iVar8;
    QPainterPath::addRect((QRectF *)&this->shape);
  }
LAB_005fad7f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void updateShape()
    {
        shape = QPainterPath();
        switch (shapeMode) {
        case QGraphicsPixmapItem::MaskShape: {
            QBitmap mask = pixmap.mask();
            if (!mask.isNull()) {
                shape = qt_regionToPath(QRegion(mask).translated(offset.toPoint()));
                break;
            }
            Q_FALLTHROUGH();
        }
        case QGraphicsPixmapItem::BoundingRectShape:
            shape.addRect(QRectF(offset.x(), offset.y(), pixmap.width(), pixmap.height()));
            break;
        case QGraphicsPixmapItem::HeuristicMaskShape:
#ifndef QT_NO_IMAGE_HEURISTIC_MASK
            shape = qt_regionToPath(QRegion(pixmap.createHeuristicMask()).translated(offset.toPoint()));
#else
            shape.addRect(QRectF(offset.x(), offset.y(), pixmap.width(), pixmap.height()));
#endif
            break;
        }
    }